

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettify.h
# Opt level: O0

size_t floaxie::prettify<16ul,char>(char *buffer,uint len,int k)

{
  format fVar1;
  int *piVar2;
  int local_34;
  size_t local_30;
  size_t field_width;
  int local_20;
  int dot_pos;
  int k_local;
  uint len_local;
  char *buffer_local;
  
  field_width._4_4_ = len + k;
  local_34 = -k;
  local_20 = k;
  dot_pos = len;
  _k_local = buffer;
  piVar2 = std::max<int>((int *)((long)&field_width + 4),&local_34);
  local_30 = (size_t)*piVar2;
  fVar1 = choose_format<16ul>(local_30);
  if (fVar1 == decimal) {
    buffer_local = (char *)print_decimal<char>(_k_local,dot_pos,local_20);
  }
  else if (fVar1 == scientific) {
    buffer_local = (char *)print_scientific<char>(_k_local,dot_pos,field_width._4_4_);
  }
  else {
    buffer_local = (char *)0x0;
  }
  return (size_t)buffer_local;
}

Assistant:

inline std::size_t prettify(CharType* buffer, const unsigned int len, const int k) noexcept
	{
		/* v = buffer * 10 ^ k
			dot_pos is such that 10 ^ (dot_pos - 1) <= v < 10 ^ dot_pos
			this way dot_pos gives the position of the comma.
		*/
		const int dot_pos = static_cast<int>(len) + k;

		// is always positive, since dot_pos is negative only when k is negative
		const std::size_t field_width = size_t((std::max)(dot_pos, -k));

		switch (choose_format<decimal_scientific_threshold>(field_width))
		{
		case format::decimal:
			return print_decimal(buffer, len, k);

		case format::scientific:
			return print_scientific(buffer, len, dot_pos);
		}

		// never reach here
		return 0;
	}